

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this,int key,char *buffer,int length)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t __n;
  AGSSocketSerial serial;
  string tag;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  uVar3 = (ulong)length;
  __n = 0x18;
  if (uVar3 < 0x18) {
    __n = uVar3;
  }
  memcpy(&local_88,buffer,__n);
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  if ((int)__n < length) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,buffer + __n,buffer + uVar3);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = local_88;
  puVar1[2] = local_84;
  puVar1[3] = local_80;
  puVar1[4] = local_7c;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,local_78);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,local_74);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  *(undefined4 **)(puVar1 + 10) = puVar1 + 0xe;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 10),local_70,local_70 + local_68);
  *(undefined8 *)(puVar1 + 0x22) = 0;
  *(undefined8 *)(puVar1 + 0x24) = 0;
  *(undefined8 *)(puVar1 + 0x1e) = 0;
  *(undefined8 *)(puVar1 + 0x20) = 0;
  *(undefined8 *)(puVar1 + 0x1a) = 0;
  *(undefined8 *)(puVar1 + 0x1c) = 0;
  *(undefined8 *)(puVar1 + 0x16) = 0;
  *(undefined8 *)(puVar1 + 0x18) = 0;
  *(undefined8 *)(puVar1 + 0x12) = 0;
  *(undefined8 *)(puVar1 + 0x14) = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(puVar1 + 0x12),0);
  puVar1[0x26] = 0;
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,key,puVar1,&agsSocket);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}